

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

uint32_t mpack_expect_ext(mpack_reader_t *reader,int8_t *type)

{
  mpack_tag_t mVar1;
  undefined1 local_28;
  undefined4 uStack_24;
  mpack_tag_t var;
  int8_t *type_local;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_read_tag(reader);
  if (mVar1.type == mpack_type_ext) {
    local_28 = mVar1.v._0_1_;
    *type = local_28;
  }
  uStack_24 = mVar1.v._4_4_;
  return uStack_24;
}

Assistant:

uint32_t mpack_expect_ext(mpack_reader_t* reader, int8_t* type) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_ext)
        *type = var.v.ext.exttype;
        return var.v.ext.length;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}